

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_mime_message_skeleton.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *__s;
  char *__format;
  char acStack_a8 [8];
  char body [32];
  char subject [18];
  char acStack_68 [8];
  char from [17];
  undefined7 local_48;
  undefined1 uStack_41;
  char to [15];
  char *file;
  
  builtin_strncpy(acStack_68,"from@exa",8);
  builtin_strncpy(from,"mple.org",9);
  to[0] = 'l';
  to[1] = 'e';
  to[2] = '.';
  to[3] = 'o';
  to[4] = 'r';
  to[5] = 'g';
  to[6] = '\0';
  local_48 = 0x6d617865406f74;
  uStack_41 = 0x70;
  builtin_strncpy(body + 0x18,"this is ",8);
  builtin_strncpy(body + 8,"sting body line",0x10);
  stack0xffffffffffffffc8 = (void *)0x0;
  builtin_strncpy(acStack_a8,"some ver",8);
  builtin_strncpy(body,"y intere",8);
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"hf:");
      if (iVar1 != 0x66) break;
      asprintf((char **)(to + 8),"%s",_optarg);
    }
    if ((iVar1 != 0x68) && (iVar1 == -1)) break;
    usage();
  }
  uVar2 = cmime_message_create_skeleton(acStack_68,&local_48,body + 0x18);
  cmime_message_set_body(uVar2,acStack_a8);
  if (stack0xffffffffffffffc8 == (void *)0x0) {
    __s = (char *)cmime_message_to_string(uVar2);
    puts(__s);
  }
  else {
    iVar1 = cmime_message_to_file();
    if (iVar1 < 1) {
      __format = "error writing file: %s\n";
    }
    else {
      __format = "file created: %s\n";
    }
    __s = (char *)0x0;
    printf(__format,stack0xffffffffffffffc8);
  }
  cmime_message_free(uVar2);
  free(stack0xffffffffffffffc8);
  free(__s);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // addresses can either be specified "just as an address" or like "John Doe <from@example.org>"
    char from[] = "from@example.org";
    char to[] = "to@example.org";
    char subject[] = "this is a subject";
    char body[] = "some very interesting body line";
    char *file = NULL;
    char *out = NULL;
    int option;

    // initialization for new CMimeMessage_T object which is created by using cmime_message_create_skeleton
    CMimeMessage_T *message = NULL;

    // check command line parameters
    while((option = getopt(argc,argv,"hf:")) != EOF) {
        switch(option) {
            case 'f':
                asprintf(&file, "%s", optarg);
                break; 
            case 'h':
                usage();
                break; 
            default:
                usage();
        }
    }

    // create a basic skeletion with cmime_message_create_skeleton
    message = cmime_message_create_skeleton(from,to,subject);
    // add the body to object
    cmime_message_set_body(message,body);

    // assign the email to out or write it to file (depending on cli options)
    if(file != NULL) {
        if(cmime_message_to_file(message,file) > 0) {
            printf("file created: %s\n", file);
        } else {
            printf("error writing file: %s\n", file);
        }
    } else {
        out = cmime_message_to_string(message);
        printf("%s\n", out);
    }

    // free the initialized object
    cmime_message_free(message);

    // some clean up
    if(file != NULL)
        free(file);
    if(out != NULL)
        free(out);

    return (0);
}